

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

tc_toktyp_t __thiscall CTcTokenizer::next(CTcTokenizer *this)

{
  tc_toktyp_t tVar1;
  wchar_t wVar2;
  int iVar3;
  CTcTokenEle *pCVar4;
  void *__src;
  CTcToken *__src_00;
  CTcTokenSource *pCVar5;
  long in_RDI;
  tc_toktyp_t typ;
  CTcToken *ext_tok;
  CTcTokenizer *in_stack_00000038;
  CTcTokenizer *in_stack_00000058;
  tc_toktyp_t local_4;
  
  memcpy((void *)(in_RDI + 0xcf0),(void *)(in_RDI + 0xcc8),0x21);
  if (*(long *)(in_RDI + 0xd20) == 0) {
    if (*(long *)(in_RDI + 0xd28) == 0) {
      do {
        do {
          tVar1 = next_on_line_xlat_keep(in_stack_00000058);
        } while (tVar1 == TOKT_NULLTOK);
        if (tVar1 != TOKT_EOF) {
          return tVar1;
        }
        wVar2 = utf8_ptr::getch((utf8_ptr *)0x28fad8);
        if (wVar2 == L'\x04') {
          return TOKT_EOF;
        }
        iVar3 = read_line_pp(in_stack_00000038);
      } while (iVar3 == 0);
      local_4 = TOKT_EOF;
    }
    else {
      __src = (void *)(**(code **)(**(long **)(in_RDI + 0xd28) + 0x10))();
      if (__src == (void *)0x0) {
        __src_00 = CTcTokenSource::get_enclosing_curtok(*(CTcTokenSource **)(in_RDI + 0xd28));
        memcpy((void *)(in_RDI + 0xcc8),__src_00,0x21);
        pCVar5 = CTcTokenSource::get_enclosing_source(*(CTcTokenSource **)(in_RDI + 0xd28));
        *(CTcTokenSource **)(in_RDI + 0xd28) = pCVar5;
        local_4 = CTcToken::gettyp((CTcToken *)(in_RDI + 0xcc8));
      }
      else {
        memcpy((void *)(in_RDI + 0xcc8),__src,0x21);
        local_4 = CTcToken::gettyp((CTcToken *)(in_RDI + 0xcc8));
      }
    }
  }
  else {
    memcpy((void *)(in_RDI + 0xcc8),*(void **)(in_RDI + 0xd20),0x21);
    pCVar4 = CTcTokenEle::getprv(*(CTcTokenEle **)(in_RDI + 0xd20));
    *(CTcTokenEle **)(in_RDI + 0xd20) = pCVar4;
    local_4 = CTcToken::gettyp((CTcToken *)(in_RDI + 0xcc8));
  }
  return local_4;
}

Assistant:

tc_toktyp_t CTcTokenizer::next()
{
    /* the current token is about to become the previous token */
    prvtok_ = curtok_;
    
    /* if there's an un-got token, return it */
    if (unget_cur_ != 0)
    {
        /* get the current unget token */
        curtok_ = *unget_cur_;

        /* we've now consumed this ungotten token */
        unget_cur_ = unget_cur_->getprv();

        /* return the new token's type */
        return curtok_.gettyp();
    }

    /* if there's an external source, get its next token */
    if (ext_src_ != 0)
    {
        const CTcToken *ext_tok;

        /* get the next token from the external source */
        ext_tok = ext_src_->get_next_token();

        /* check to see if we got a token */
        if (ext_tok == 0)
        {
            /* 
             *   restore the current token in effect before this source was
             *   active 
             */
            curtok_ = *ext_src_->get_enclosing_curtok();

            /* 
             *   this source has no more tokens - restore the enclosing
             *   source, and keep going so we try getting a token from it 
             */
            ext_src_ = ext_src_->get_enclosing_source();

            /* return the token type */
            return curtok_.gettyp();
        }
        else
        {
            /* we got a token - copy it to our internal token buffer */
            curtok_ = *ext_tok;

            /* return its type */
            return curtok_.gettyp();
        }
    }
    
    /* keep going until we get a valid token */
    for (;;)
    {
        /* 
         *   read the next token from the current line, applying
         *   appropriate string translations and storing strings and
         *   symbols in the source block list 
         */
        tc_toktyp_t typ = next_on_line_xlat_keep();

        /* if it's the "null" token, skip it and read another token */
        if (typ == TOKT_NULLTOK)
            continue;

        /* if we found a valid token, we're done - return the token */
        if (typ != TOKT_EOF)
            return typ;

        /* 
         *   if we're at the end of a preprocess line, don't read another
         *   line - just return end of file 
         */
        if (p_.getch() == TOK_END_PP_LINE)
            return TOKT_EOF;

        /* 
         *   we've reached the end of the line - read another line,
         *   applying preprocessing directives and expanding macros as
         *   needed 
         */
        if (read_line_pp())
        {
            /* no more lines are available - return end of file */
            return TOKT_EOF;
        }
    }
}